

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImmutableList.cpp
# Opt level: O3

void __thiscall
regex::ImmutableStringBuilder<8>::AppendUInt64(ImmutableStringBuilder<8> *this,uint64 value)

{
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  undefined4 *puVar4;
  WCHAR local_48 [4];
  WCHAR buffer [21];
  
  HVar3 = StringCchPrintfW(local_48,0x15,L"%llu",value);
  if (-1 < HVar3) {
    AppendWithCopy(this,local_48);
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ImmutableList.cpp"
                     ,0x25,"(((HRESULT)(hr) >= 0))","StringCchPrintfW");
  if (bVar2) {
    *puVar4 = 0;
    Js::Throw::OutOfMemory();
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void regex::ImmutableStringBuilder<chunkSize>::AppendUInt64(uint64 value)
{
    WCHAR buffer[21]; // 18,446,744,073,709,551,615 w.o ',' + \0
    HRESULT hr = S_OK;
    hr = StringCchPrintfW(buffer, _countof(buffer), _u("%llu"), value);
    AssertMsg(SUCCEEDED(hr), "StringCchPrintfW");
    if (FAILED(hr) )
    {
        Js::Throw::OutOfMemory();
    }

    // append to the stringBuilder string
    this->AppendWithCopy(buffer);
}